

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# splitview.c
# Opt level: O3

void cursorPosFun(GLFWwindow *window,double x,double y)

{
  double *pdVar1;
  int *piVar2;
  int *piVar3;
  double *pdVar4;
  double dVar5;
  double dVar6;
  int fb_height;
  int fb_width;
  int wnd_height;
  int wnd_width;
  int local_28;
  int local_24;
  int local_20;
  int local_1c;
  
  glfwGetWindowSize(window,&local_1c,&local_20);
  glfwGetFramebufferSize(window,&local_24,&local_28);
  xpos = x * ((double)local_24 / (double)local_1c);
  ypos = ((double)local_24 / (double)local_1c) * y;
  piVar2 = &rot_z;
  pdVar1 = &xpos;
  piVar3 = &rot_x;
  pdVar4 = &ypos;
  dVar5 = ypos;
  dVar6 = xpos;
  if (active_view != 1) {
    if (active_view == 4) {
      pdVar1 = &ypos;
      piVar3 = &rot_y;
      pdVar4 = &xpos;
      dVar5 = xpos;
      dVar6 = ypos;
    }
    else {
      if (active_view != 3) {
        return;
      }
      piVar2 = &rot_y;
    }
  }
  *piVar3 = *piVar3 + (int)(dVar5 - *pdVar4);
  *piVar2 = *piVar2 + (int)(dVar6 - *pdVar1);
  do_redraw = 0;
  return;
}

Assistant:

static void cursorPosFun(GLFWwindow* window, double x, double y)
{
    int wnd_width, wnd_height, fb_width, fb_height;
    double scale;

    glfwGetWindowSize(window, &wnd_width, &wnd_height);
    glfwGetFramebufferSize(window, &fb_width, &fb_height);

    scale = (double) fb_width / (double) wnd_width;

    x *= scale;
    y *= scale;

    // Depending on which view was selected, rotate around different axes
    switch (active_view)
    {
        case 1:
            rot_x += (int) (y - ypos);
            rot_z += (int) (x - xpos);
            do_redraw = 1;
            break;
        case 3:
            rot_x += (int) (y - ypos);
            rot_y += (int) (x - xpos);
            do_redraw = 1;
            break;
        case 4:
            rot_y += (int) (x - xpos);
            rot_z += (int) (y - ypos);
            do_redraw = 1;
            break;
        default:
            // Do nothing for perspective view, or if no view is selected
            break;
    }

    // Remember cursor position
    xpos = x;
    ypos = y;
}